

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O0

void __thiscall
SQCompilation::RenderVisitor::visitDoWhileStatement(RenderVisitor *this,DoWhileStatement *loop)

{
  DoWhileStatement *in_RSI;
  RenderVisitor *in_RDI;
  Node *unaff_retaddr;
  char c;
  RenderVisitor *visitor;
  
  visitor = in_RDI;
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  in_RDI->_indent = in_RDI->_indent + 2;
  (*(in_RDI->super_Visitor)._vptr_Visitor[0x19])(in_RDI,in_RSI);
  in_RDI->_indent = in_RDI->_indent + -2;
  indent((RenderVisitor *)in_RSI,(int)((ulong)in_RDI >> 0x20));
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  c = (char)((ulong)in_RDI >> 0x38);
  newLine((RenderVisitor *)0x122a3d);
  DoWhileStatement::condition(in_RSI);
  Node::visit<SQCompilation::RenderVisitor>(unaff_retaddr,visitor);
  OutputStream::writeChar((OutputStream *)in_RSI,c);
  return;
}

Assistant:

virtual void visitDoWhileStatement(DoWhileStatement *loop) {
        _out->writeString("DO");

        _indent += 2;
        visitLoopStatement(loop);
        _indent -= 2;

        indent(_indent);
        _out->writeString("WHILE (");
        newLine();
        loop->condition()->visit(this);
        _out->writeChar(')');
    }